

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

color_quad_u8 __thiscall
crnlib::dxt1_block::unpack_color(dxt1_block *this,uint16 packed_color,bool scaled,uint alpha)

{
  uint uVar1;
  undefined7 in_register_00000011;
  undefined6 in_register_00000032;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint8 uVar5;
  
  uVar2 = CONCAT62(in_register_00000032,packed_color);
  uVar3 = (uint)uVar2 & 0x1f;
  uVar4 = (uint)(uVar2 >> 5) & 0x3f;
  uVar5 = (uint8)(uVar2 >> 0xb);
  if ((int)CONCAT71(in_register_00000011,scaled) != 0) {
    uVar3 = (uVar3 >> 2) + uVar3 * 8;
    uVar4 = (uVar4 >> 4) + uVar4 * 4;
    uVar5 = (char)((uint)uVar2 >> 0xd) + uVar5 * '\b';
  }
  uVar1 = 0xff;
  if (alpha < 0xff) {
    uVar1 = alpha;
  }
  this->m_low_color[0] = uVar5;
  this->m_low_color[1] = (uint8)uVar4;
  this->m_high_color[0] = (uint8)uVar3;
  this->m_high_color[1] = (uint8)uVar1;
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint alpha)
    {
        uint b = packed_color & 31U;
        uint g = (packed_color >> 5U) & 63U;
        uint r = (packed_color >> 11U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 2U) | (g >> 4U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
    }